

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O1

ssize_t __thiscall
pstore::romfs::descriptor::read(descriptor *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  undefined4 in_register_00000034;
  size_t sVar6;
  
  if (__nbytes == 0 || __buf == (void *)0x0) {
    __nbytes = 0;
  }
  else {
    peVar1 = (this->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pvVar2 = (peVar1->dir_->contents_).ptr_;
    uVar3 = (peVar1->dir_->stat_).size;
    sVar4 = peVar1->pos_;
    lVar5 = 0;
    sVar6 = 0;
    do {
      if (uVar3 < peVar1->pos_ + (long)__buf) {
        return sVar6;
      }
      memcpy((void *)(CONCAT44(in_register_00000034,__fd) + lVar5),
             (void *)((long)pvVar2 + lVar5 + sVar4),(size_t)__buf);
      peVar1->pos_ = peVar1->pos_ + (long)__buf;
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + (long)__buf;
    } while (__nbytes != sVar6);
  }
  return __nbytes;
}

Assistant:

std::size_t descriptor::read (not_null<void *> const buffer, std::size_t const size,
                                      std::size_t const count) {
            return f_->read (buffer, size, count);
        }